

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int fdParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int local_50;
  int fd;
  int res;
  int size;
  char *base;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  char *pcStack_28;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  _res = (char *)0x0;
  local_50 = 0;
  nb_tests = nb_tests + 1;
  ctxt._4_4_ = options;
  pcStack_28 = err;
  err_local = result;
  result_local = filename;
  iVar1 = open64(filename,0);
  if ((ctxt._4_4_ & 0x40000000) == 0) {
    doc = (xmlDocPtr)xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(doc,testStructuredErrorHandler,0);
    base = (char *)xmlCtxtReadFd(doc,iVar1,result_local,0,ctxt._4_4_);
    xmlFreeParserCtxt(doc);
  }
  else {
    doc = (xmlDocPtr)htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(doc,testStructuredErrorHandler,0);
    base = (char *)htmlCtxtReadFd(doc,iVar1,result_local,0,ctxt._4_4_);
    htmlFreeParserCtxt(doc);
  }
  close(iVar1);
  if (err_local != (char *)0x0) {
    if (base == (char *)0x0) {
      _res = "";
      fd = 0;
    }
    else if ((ctxt._4_4_ & 0x40000000) == 0) {
      xmlDocDumpMemory(base,&res,&fd);
    }
    else {
      htmlDocDumpMemory(base,&res,&fd);
    }
    local_50 = compareFileMem(err_local,_res,fd);
  }
  if (base != (char *)0x0) {
    if (_res != (char *)0x0) {
      (*_xmlFree)(_res);
    }
    xmlFreeDoc(base);
  }
  if (local_50 == 0) {
    if (pcStack_28 == (char *)0x0) {
      if (((ctxt._4_4_ & 0x10) != 0) && (testErrorsSize != 0)) {
        fprintf(_stderr,"Validation for %s failed\n",result_local);
      }
    }
    else {
      iVar1 = compareFileMem(pcStack_28,testErrors,testErrorsSize);
      if (iVar1 != 0) {
        fprintf(_stderr,"Error for %s failed\n",result_local);
        return -1;
      }
    }
    filename_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Result for %s failed in %s\n",result_local,err_local);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
fdParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base = NULL;
    int size, res = 0, fd;

    nb_tests++;
    fd = open(filename, RD_FLAGS);
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        ctxt = htmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
        doc = htmlCtxtReadFd(ctxt, fd, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
    } else
#endif
    {
        ctxt = xmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
	doc = xmlCtxtReadFd(ctxt, fd, filename, NULL, options);
        xmlFreeParserCtxt(ctxt);
    }
    close(fd);
    if (result) {
	if (doc == NULL) {
	    base = "";
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	}
	res = compareFileMem(result, base, size);
    }
    if (doc != NULL) {
	if (base != NULL)
	    xmlFree((char *)base);
	xmlFreeDoc(doc);
    }
    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        return(-1);
    }
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0)
	    fprintf(stderr, "Validation for %s failed\n", filename);
    }

    return(0);
}